

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

void spawn_character(tgestate_t *state,characterstruct_t *charstr)

{
  room_t rVar1;
  undefined4 uVar2;
  spritedef_t *psVar3;
  char cVar4;
  byte bVar5;
  uint8_t uVar6;
  ushort uVar7;
  int iVar8;
  character_class_data_t *pcVar9;
  vischar_t *vischar;
  route_t *route;
  pos8_t *location;
  mappos8_t *doormappos;
  pos8_t *local_40;
  mappos8_t *local_38;
  
  if ((charstr->character_and_flags & 0x40) == 0) {
    vischar = state->vischars;
    cVar4 = -7;
    do {
      vischar = vischar + 1;
      if (vischar->character == 0xff) {
        state->IY = vischar;
        bVar5 = (charstr->mappos).u;
        if (charstr->room == '\0') {
          (state->saved_mappos).pos16.u = (ushort)bVar5 << 3;
          (state->saved_mappos).pos16.v = (ushort)(charstr->mappos).v << 3;
          uVar7 = (ushort)(charstr->mappos).w << 3;
        }
        else {
          *(ushort *)&state->saved_mappos = (ushort)bVar5;
          *(ushort *)((long)&state->saved_mappos + 2) = (ushort)(charstr->mappos).v;
          uVar7 = (ushort)(charstr->mappos).w;
        }
        *(ushort *)((long)&state->saved_mappos + 4) = uVar7;
        iVar8 = collision(state);
        if (iVar8 == 0) {
          iVar8 = bounds_check(state,vischar);
        }
        if (iVar8 == 1) {
          return;
        }
        bVar5 = charstr->character_and_flags;
        charstr->character_and_flags = bVar5 | 0x40;
        bVar5 = bVar5 & 0x1f;
        vischar->character = bVar5;
        vischar->flags = '\0';
        if (bVar5 == 0) {
          pcVar9 = spawn_character::character_class_data;
        }
        else if (bVar5 < 0x10) {
          pcVar9 = spawn_character::character_class_data + 1;
        }
        else {
          pcVar9 = spawn_character::character_class_data + (ulong)(0x13 < bVar5) + 2;
        }
        psVar3 = pcVar9->sprite;
        vischar->animbase = pcVar9->animbase;
        (vischar->mi).sprite = psVar3;
        uVar2 = *(undefined4 *)&state->saved_mappos;
        (vischar->mi).mappos.u = (short)uVar2;
        (vischar->mi).mappos.v = (short)((uint)uVar2 >> 0x10);
        (vischar->mi).mappos.w = (state->saved_mappos).pos16.w;
        rVar1 = state->room_index;
        vischar->room = rVar1;
        if (rVar1 != '\0') {
          play_speaker(state,sound_CHARACTER_ENTERS_2);
          play_speaker(state,sound_CHARACTER_ENTERS_1);
        }
        vischar->route = charstr->route;
        if ((charstr->route).index == '\0') goto LAB_0010ab54;
        route = &charstr->route;
        goto LAB_0010aae7;
      }
      cVar4 = cVar4 + '\x01';
    } while (cVar4 != '\0');
  }
  return;
  while (route_ended(state,vischar,&vischar->route), route = &vischar->route,
        (vischar->route).index != '\0') {
LAB_0010aae7:
    state->entered_move_a_character = '\0';
    uVar6 = get_target(state,route,&local_38,&local_40);
    if (uVar6 != 0xff) {
      if (uVar6 == 0x80) {
        vischar->flags = vischar->flags | 0x40;
        (vischar->target).w = local_38->w;
        uVar6 = local_38->v;
        (vischar->target).u = local_38->u;
        (vischar->target).v = uVar6;
      }
      else {
        (vischar->target).u = local_40->x;
        (vischar->target).v = local_40->y;
      }
      break;
    }
  }
LAB_0010ab54:
  vischar->counter_and_flags = '\0';
  (state->saved_mappos).pos16.w = (vischar->mi).mappos.w;
  *(undefined4 *)&state->saved_mappos = *(undefined4 *)&(vischar->mi).mappos;
  (vischar->isopos).x = ((state->saved_mappos).pos16.v - (state->saved_mappos).pos16.u) * 2 + 0x400;
  (vischar->isopos).y =
       0x800 - ((state->saved_mappos).pos16.u + (state->saved_mappos).pos16.v +
               (state->saved_mappos).pos16.w);
  character_behaviour(state,vischar);
  return;
}

Assistant:

void spawn_character(tgestate_t *state, characterstruct_t *charstr)
{
  /**
   * $CD9A: Data for the four classes of characters.
   */
  static const character_class_data_t character_class_data[4] =
  {
    { &animations[0], &sprites[sprite_COMMANDANT_FACING_AWAY_1] },
    { &animations[0], &sprites[sprite_GUARD_FACING_AWAY_1]      },
    { &animations[0], &sprites[sprite_DOG_FACING_AWAY_1]        },
    { &animations[0], &sprites[sprite_PRISONER_FACING_AWAY_1]   },
  };

  vischar_t                    *vischar;      /* was HL/IY */
  uint8_t                       iters;        /* was B */
  characterstruct_t            *charstr2;     /* was DE */
  mappos16_t                   *saved_mappos; /* was HL */
  character_t                   character;    /* was A */
  const character_class_data_t *metadata;     /* was DE */
  int                           Z;            /* flag */
  room_t                        room;         /* was A */
  uint8_t                       target_type;  /* was A */
  const mappos8_t              *doormappos;   /* was HL */
  const pos8_t                 *location;     /* was HL */
  route_t                      *route;        /* was HL */

  assert(state   != NULL);
  assert(charstr != NULL);

  /* Skip spawning if the character is already on-screen. */
  if (charstr->character_and_flags & characterstruct_FLAG_ON_SCREEN)
    return; /* already spawned */

  /* Find an empty slot in the visible character list. */
  vischar = &state->vischars[1];
  iters = vischars_LENGTH - 1;
  do
  {
    if (vischar->character == character_NONE)
      goto found_empty_slot;
    vischar++;
  }
  while (--iters);

  return; /* no spare slot */


found_empty_slot:
  state->IY = vischar;
  charstr2 = charstr; /* Conv: Original points at charstr.room */

  /* Scale coords dependent on which room the character is in. */
  saved_mappos = &state->saved_mappos.pos16;
  if (charstr2->room == room_0_OUTDOORS)
  {
    /* Conv: Unrolled. */
    saved_mappos->u = charstr2->mappos.u * 8;
    saved_mappos->v = charstr2->mappos.v * 8;
    saved_mappos->w = charstr2->mappos.w * 8;
  }
  else
  {
    /* Conv: Unrolled. */
    saved_mappos->u = charstr2->mappos.u;
    saved_mappos->v = charstr2->mappos.v;
    saved_mappos->w = charstr2->mappos.w;
  }

  Z = collision(state);
  if (Z == 0) /* no collision */
    Z = bounds_check(state, vischar);
  if (Z == 1)
    return; /* a character or bounds collision occurred */

  /* Transfer character struct to vischar. */
  character = charstr->character_and_flags | characterstruct_FLAG_ON_SCREEN;
  charstr->character_and_flags = character;

  character &= characterstruct_CHARACTER_MASK;
  vischar->character = character;
  vischar->flags     = 0;

  metadata = &character_class_data[0]; /* Commandant */
  if (character != 0)
  {
    metadata = &character_class_data[1]; /* Guard */
    if (character >= 16)
    {
      metadata = &character_class_data[2]; /* Dog */
      if (character >= 20)
      {
        metadata = &character_class_data[3]; /* Prisoner */
      }
    }
  }

  vischar->animbase  = metadata->animbase;
  vischar->mi.sprite = metadata->sprite;
  memcpy(&vischar->mi.mappos, &state->saved_mappos, sizeof(mappos16_t));

  room = state->room_index;
  vischar->room = room;
  if (room > room_0_OUTDOORS)
  {
    play_speaker(state, sound_CHARACTER_ENTERS_2);
    play_speaker(state, sound_CHARACTER_ENTERS_1);
  }

  vischar->route = charstr->route;

  /* Conv: Removed DE handling here and below which isn't used in this port. */
  route = &charstr->route;
again:
  if (route->index != routeindex_0_HALT) /* if not stood still */
  {
    state->entered_move_a_character = 0;
    target_type = get_target(state, route, &doormappos, &location);
    if (target_type == get_target_ROUTE_ENDS)
    {
      route_ended(state, vischar, &vischar->route);

      /* To match the original code this should now jump to 'again' with 'route'
       * pointing to vischar->route, not charstr->route as used on the first
       * round. */
      route = &vischar->route;

      /* Jump back and try again. */
      goto again;
    }
    else if (target_type == get_target_DOOR)
    {
      vischar->flags |= vischar_FLAGS_TARGET_IS_DOOR;
    }
    if (target_type == get_target_DOOR)
    {
      vischar->target = *doormappos;
    }
    else
    {
      vischar->target.u = location->x;
      vischar->target.v = location->y;
      /* Note: We're not assigning .height here. */
    }
  }

  vischar->counter_and_flags = 0;
  calc_vischar_isopos_from_vischar(state, vischar);
  character_behaviour(state, vischar); /* was tail call */
}